

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1objs.c
# Opt level: O0

FT_Error T1_Size_Request(FT_Size t1size,FT_Size_Request req)

{
  FT_Error FVar1;
  PSH_Globals_Funcs pPVar2;
  PSH_Globals_Funcs funcs;
  T1_Size size;
  FT_Error error;
  FT_Size_Request req_local;
  FT_Size t1size_local;
  
  pPVar2 = T1_Size_Get_Globals_Funcs((T1_Size)t1size);
  FVar1 = FT_Request_Metrics(t1size->face,req);
  if ((FVar1 == 0) && (pPVar2 != (PSH_Globals_Funcs)0x0)) {
    (*pPVar2->set_scale)
              ((PSH_Globals)t1size->internal->module_data,(t1size->metrics).x_scale,
               (t1size->metrics).y_scale,0,0);
  }
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Size_Request( FT_Size          t1size,     /* T1_Size */
                   FT_Size_Request  req )
  {
    FT_Error  error;

    T1_Size            size  = (T1_Size)t1size;
    PSH_Globals_Funcs  funcs = T1_Size_Get_Globals_Funcs( size );


    error = FT_Request_Metrics( size->root.face, req );
    if ( error )
      goto Exit;

    if ( funcs )
      funcs->set_scale( (PSH_Globals)t1size->internal->module_data,
                        size->root.metrics.x_scale,
                        size->root.metrics.y_scale,
                        0, 0 );

  Exit:
    return error;
  }